

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O3

void CGL::Viewer::resize_callback(GLFWwindow *window,int width,int height)

{
  undefined8 in_RAX;
  int h;
  int w;
  undefined8 local_18;
  
  local_18 = in_RAX;
  glfwGetFramebufferSize(window,(int *)((long)&local_18 + 4),(int *)&local_18);
  buffer_w = (size_t)local_18._4_4_;
  buffer_h = (size_t)(int)local_18;
  glViewport(0,0);
  OSDText::resize(osd_text,buffer_w,buffer_h);
  if (renderer != (long *)0x0) {
    (**(code **)(*renderer + 0x20))(renderer,buffer_w,buffer_h);
  }
  return;
}

Assistant:

void Viewer::resize_callback( GLFWwindow* window, int width, int height ) {

  // get framebuffer size
  int w, h; 
  glfwGetFramebufferSize(window, &w, &h );
    
  // update buffer size
  buffer_w = w; buffer_h = h;
  glViewport( 0, 0, buffer_w, buffer_h );

  // resize on-screen display
  osd_text->resize(buffer_w, buffer_h);

  // resize render if there is a user space renderer
  if (renderer) renderer->resize( buffer_w, buffer_h );  
}